

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

int __thiscall
DnsStats::SubmitName
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,bool should_tabulate)

{
  uint number;
  uint32_t l;
  bool should_tabulate_local;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  l = start;
  while( true ) {
    if (length <= l) {
      return l;
    }
    number = (uint)packet[l];
    if (number == 0) {
      if (should_tabulate) {
        SubmitRegistryNumber(this,7,0);
      }
      return l + 1;
    }
    if ((number & 0xc0) == 0xc0) {
      if (should_tabulate) {
        SubmitRegistryNumber(this,7,0xc0);
      }
      if (length < l + 2) {
        this->error_flags = this->error_flags | 0x100;
        return length;
      }
      return l + 2;
    }
    if (0x3f < number) {
      this->error_flags = this->error_flags | 0x80;
      if (!should_tabulate) {
        return length;
      }
      SubmitRegistryNumber(this,7,number);
      return length;
    }
    if (should_tabulate) {
      SubmitRegistryNumber(this,7,0);
    }
    if (length < l + number + 1) break;
    l = number + 1 + l;
  }
  this->error_flags = this->error_flags | 0x100;
  return length;
}

Assistant:

int DnsStats::SubmitName(uint8_t * packet, uint32_t length, uint32_t start, bool should_tabulate)
{
    uint32_t l = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            start++;
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0xC0);
            }

            if ((start + 2) > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += 2;
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            error_flags |= DNS_REGISTRY_ERROR_LABEL;
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, l);
            }
            start = length;
            break;
        }
        else
        {
            /* regular name part. To do: tracking of underscore labels. */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            if (start + l + 1 > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += l + 1;
            }
        }
    }

    return start;
}